

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O0

void __thiscall echo_server::on_new_connection(echo_server *this)

{
  connection *this_00;
  pointer local_30;
  connection *pcc;
  unique_ptr<echo_server::connection,_std::default_delete<echo_server::connection>_> local_18;
  unique_ptr<echo_server::connection,_std::default_delete<echo_server::connection>_> cc;
  echo_server *this_local;
  
  cc._M_t.
  super___uniq_ptr_impl<echo_server::connection,_std::default_delete<echo_server::connection>_>._M_t
  .super__Tuple_impl<0UL,_echo_server::connection_*,_std::default_delete<echo_server::connection>_>.
  super__Head_base<0UL,_echo_server::connection_*,_false>._M_head_impl =
       (__uniq_ptr_data<echo_server::connection,_std::default_delete<echo_server::connection>,_true,_true>
        )(__uniq_ptr_data<echo_server::connection,_std::default_delete<echo_server::connection>,_true,_true>
          )this;
  this_00 = (connection *)operator_new(0x638);
  connection::connection(this_00,this);
  std::unique_ptr<echo_server::connection,std::default_delete<echo_server::connection>>::
  unique_ptr<std::default_delete<echo_server::connection>,void>
            ((unique_ptr<echo_server::connection,std::default_delete<echo_server::connection>> *)
             &local_18,this_00);
  local_30 = std::unique_ptr<echo_server::connection,_std::default_delete<echo_server::connection>_>
             ::get(&local_18);
  std::
  map<echo_server::connection*,std::unique_ptr<echo_server::connection,std::default_delete<echo_server::connection>>,std::less<echo_server::connection*>,std::allocator<std::pair<echo_server::connection*const,std::unique_ptr<echo_server::connection,std::default_delete<echo_server::connection>>>>>
  ::
  emplace<echo_server::connection*&,std::unique_ptr<echo_server::connection,std::default_delete<echo_server::connection>>>
            ((map<echo_server::connection*,std::unique_ptr<echo_server::connection,std::default_delete<echo_server::connection>>,std::less<echo_server::connection*>,std::allocator<std::pair<echo_server::connection*const,std::unique_ptr<echo_server::connection,std::default_delete<echo_server::connection>>>>>
              *)&this->connections,&local_30,&local_18);
  std::unique_ptr<echo_server::connection,_std::default_delete<echo_server::connection>_>::
  ~unique_ptr(&local_18);
  return;
}

Assistant:

void echo_server::on_new_connection()
{
    std::unique_ptr<connection> cc(new connection(this));
    connection* pcc = cc.get();
    connections.emplace(pcc, std::move(cc));
}